

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O0

Node * __thiscall ScapeGoatTree::findMin(ScapeGoatTree *this,Node *node)

{
  Node *node_local;
  ScapeGoatTree *this_local;
  
  if (node == (Node *)0x0) {
    this_local = (ScapeGoatTree *)0x0;
  }
  else {
    this_local = (ScapeGoatTree *)node;
    if (node->leftChild != (Node *)0x0) {
      this_local = (ScapeGoatTree *)findMin(this,node->leftChild);
    }
  }
  return (Node *)this_local;
}

Assistant:

ScapeGoatTree::Node *ScapeGoatTree::findMin(Node *node) {
    if (node == nullptr) {
        return nullptr;
    } else if (node->leftChild == nullptr) {
        return node;
    } else {
        return findMin(node->leftChild);
    }
}